

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::SingleVertexArrayNormalizeTests::init
          (SingleVertexArrayNormalizeTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SingleVertexArrayNormalizeGroup *this_00;
  long lVar1;
  
  lVar1 = 0;
  do {
    this_00 = (SingleVertexArrayNormalizeGroup *)operator_new(0x80);
    SingleVertexArrayNormalizeGroup::SingleVertexArrayNormalizeGroup
              (this_00,(this->super_TestCaseGroup).m_context,
               *(InputType *)((long)&DAT_00b18bd0 + lVar1));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x2c);
  return extraout_EAX;
}

Assistant:

void SingleVertexArrayNormalizeTests::init (void)
{
	// Test normalization with different input types, component counts and storage
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_UNSIGNED_INT, Array::INPUTTYPE_INT, Array::INPUTTYPE_HALF , Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayNormalizeGroup(m_context, inputTypes[inputTypeNdx]));
	}
}